

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O1

bool __thiscall
MeCab::EncoderFeatureIndex::save(EncoderFeatureIndex *this,char *filename,char *header)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  long lVar3;
  ostream *poVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  ofstream ofs;
  undefined1 auStack_238 [7];
  char local_231;
  long local_230;
  filebuf local_228 [16];
  uint auStack_218 [56];
  ios_base local_138 [264];
  
  if (header == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x29d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"header",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
    die::~die((die *)&local_230);
  }
  if ((this->super_FeatureIndex).alpha_ == (double *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x29e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"alpha_",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
    die::~die((die *)&local_230);
  }
  std::ofstream::ofstream(&local_230,filename,_S_out);
  lVar3 = *(long *)(local_230 + -0x18);
  uVar2 = *(uint *)((long)auStack_218 + lVar3 + 8);
  if ((uVar2 & 5) == 0) {
    *(uint *)((long)auStack_218 + lVar3) = *(uint *)((long)auStack_218 + lVar3) & 0xfffffefb | 4;
    *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 0x10;
    if (header == (char *)0x0) {
      std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_230 + -0x18) + 8);
    }
    else {
      sVar5 = strlen(header);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,header,sVar5);
    }
    std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    p_Var6 = (this->dic_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->dic_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        poVar4 = std::ostream::_M_insert<double>
                           ((this->super_FeatureIndex).alpha_[(int)p_Var6[2]._M_color]);
        local_231 = '\t';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_231,1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
        local_231 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_231,1);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return (uVar2 & 5) == 0;
}

Assistant:

bool EncoderFeatureIndex::save(const char *filename, const char *header) const {
  CHECK_DIE(header);
  CHECK_DIE(alpha_);

  std::ofstream ofs(WPATH(filename));
  if (!ofs) {
    return false;
  }

  ofs.setf(std::ios::fixed, std::ios::floatfield);
  ofs.precision(16);

  ofs << header;
  ofs << std::endl;

  for (std::map<std::string, int>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    ofs << alpha_[it->second] << '\t' << it->first << '\n';
  }

  return true;
}